

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void chebyshev1_compute(int n,double *x,double *w)

{
  ulong uVar1;
  ostream *poVar2;
  int iVar3;
  double dVar4;
  
  if (0 < n) {
    uVar1 = 0;
    do {
      w[uVar1] = 3.141592653589793 / (double)n;
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
    iVar3 = n * 2 + -1;
    uVar1 = 0;
    do {
      dVar4 = cos(((double)iVar3 * 3.141592653589793) / (double)(n * 2));
      x[uVar1] = dVar4;
      uVar1 = uVar1 + 1;
      iVar3 = iVar3 + -2;
    } while ((uint)n != uVar1);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"CHEBYSHEV1_COMPUTE - Fatal error!\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
  std::operator<<(poVar2,"\n");
  exit(1);
}

Assistant:

void chebyshev1_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBYSHEV1_COMPUTE computes a Gauss-Chebyshev type 1 quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) F(X) / sqrt ( 1 - x^2 ) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    26 February 2008
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//  Parameters:
//
//    Input, int N, the order.
//    N must be greater than 0.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  const double r8_pi = 3.141592653589793;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "CHEBYSHEV1_COMPUTE - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    exit ( 1 );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = r8_pi / double( n );
  }
  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( r8_pi * double( 2 * n - 1 - 2 * i ) 
                       / double( 2 * n ) );
  }

  return;
}